

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<short>::test_small_numerators<(libdivide::Branching)0>
          (DivideTest<short> *this,short denom,divider<short,_(libdivide::Branching)0> *the_divider)

{
  short numer;
  int32_t i;
  int iVar1;
  
  numer = 0;
  iVar1 = 0;
  do {
    test_one<(libdivide::Branching)0>(this,(short)iVar1,denom,the_divider);
    test_one<(libdivide::Branching)0>(this,numer,denom,the_divider);
    iVar1 = iVar1 + 1;
    numer = numer + -1;
  } while (iVar1 != 0x4000);
  return;
}

Assistant:

void test_small_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test small numerators < 2^16
        // balance signed & unsigned testing
#if defined(__AVR__)
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 7 : (uint32_t)1 << 8;
#else
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 14 : (uint32_t)1 << 16;
#endif
        for (int32_t i = 0; i < small_stop; ++i) {
            test_one((T)i, denom, the_divider);

            if (limits::is_signed) {
                test_one((T)-i, denom, the_divider);
            }
        }
    }